

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_loadDictionaryContent
                 (ZSTD_matchState_t *ms,ZSTD_CCtx_params *params,void *src,size_t srcSize,
                 ZSTD_dictTableLoadMethod_e dtlm)

{
  BYTE *iend;
  uint uVar1;
  U32 UVar2;
  undefined4 extraout_var;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ZSTD_compressionParameters *cParams;
  ulong uVar3;
  
  iend = (BYTE *)((long)src + srcSize);
  ZSTD_window_update(&ms->window,src,srcSize);
  uVar1 = 0;
  if (params->forceWindow == 0) {
    uVar1 = (int)iend - *(int *)&(ms->window).base;
  }
  uVar3 = (ulong)uVar1;
  ms->loadedDictEnd = uVar1;
  if (8 < srcSize) {
    uVar1 = (params->cParams).strategy - ZSTD_fast;
    uVar3 = (ulong)uVar1;
    if (uVar1 < 8) {
      cParams = &params->cParams;
      switch(uVar3) {
      case 0:
        ZSTD_fillHashTable(ms,cParams,iend,dtlm);
        uVar3 = extraout_RAX_00;
        break;
      case 1:
        ZSTD_fillDoubleHashTable(ms,cParams,iend,dtlm);
        uVar3 = extraout_RAX_01;
        break;
      default:
        UVar2 = ZSTD_insertAndFindFirstIndex(ms,cParams,iend + -8);
        uVar3 = CONCAT44(extraout_var,UVar2);
        break;
      case 5:
      case 6:
      case 7:
        ZSTD_updateTree(ms,cParams,iend + -8,iend);
        uVar3 = extraout_RAX;
      }
    }
    ms->nextToUpdate = (int)iend - *(int *)&(ms->window).base;
  }
  return uVar3;
}

Assistant:

static size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t* ms,
                                         ZSTD_CCtx_params const* params,
                                         const void* src, size_t srcSize,
                                         ZSTD_dictTableLoadMethod_e dtlm)
{
    const BYTE* const ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    ZSTD_compressionParameters const* cParams = &params->cParams;

    ZSTD_window_update(&ms->window, src, srcSize);
    ms->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ms->window.base);

    if (srcSize <= HASH_READ_SIZE) return 0;

    switch(params->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, cParams, iend, dtlm);
        break;
    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, cParams, iend, dtlm);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
        if (srcSize >= HASH_READ_SIZE)
            ZSTD_insertAndFindFirstIndex(ms, cParams, iend-HASH_READ_SIZE);
        break;

    case ZSTD_btlazy2:   /* we want the dictionary table fully sorted */
    case ZSTD_btopt:
    case ZSTD_btultra:
        if (srcSize >= HASH_READ_SIZE)
            ZSTD_updateTree(ms, cParams, iend-HASH_READ_SIZE, iend);
        break;

    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    ms->nextToUpdate = (U32)(iend - ms->window.base);
    return 0;
}